

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::vSolveRight4update
          (CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *eps,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *vec,int *idx,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *rhs,int *ridx,int rn,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *forest,int *forestNum,int *forestIdx)

{
  uint *puVar1;
  int iVar2;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *vec_00;
  int *ridx_00;
  bool bVar3;
  bool bVar4;
  long lVar5;
  int j;
  int j_1;
  int local_25c;
  int *local_258;
  int32_t local_250;
  fpclass_type local_24c;
  int *local_248;
  int *local_240;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_238;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_230;
  int *local_228;
  int *local_220;
  ulong local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_168;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  local_68.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
  local_68.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
  local_68.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
  local_68.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
  local_68.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
  local_68.m_backend.exp = (eps->m_backend).exp;
  local_68.m_backend.neg = (eps->m_backend).neg;
  local_68.m_backend.fpclass = (eps->m_backend).fpclass;
  local_68.m_backend.prec_elem = (eps->m_backend).prec_elem;
  local_230 = vec;
  local_228 = idx;
  vSolveLright(this,rhs,ridx,&rn,&local_68);
  local_238 = this;
  if (forest == (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)0x0) {
    local_258 = (this->row).perm;
    local_218 = local_218 & 0xffffffff00000000;
    for (lVar5 = 0; lVar5 < rn; lVar5 = lVar5 + 1) {
      iVar2 = ridx[lVar5];
      local_168.m_backend.exp = rhs[iVar2].m_backend.exp;
      local_168.m_backend.neg = rhs[iVar2].m_backend.neg;
      local_168.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)(rhs[iVar2].m_backend.data._M_elems + 8);
      local_168.m_backend.data._M_elems._0_8_ = *(undefined8 *)rhs[iVar2].m_backend.data._M_elems;
      local_168.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)(rhs[iVar2].m_backend.data._M_elems + 2);
      puVar1 = rhs[iVar2].m_backend.data._M_elems + 4;
      local_168.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_168.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      local_168.m_backend.fpclass = rhs[iVar2].m_backend.fpclass;
      local_168.m_backend.prec_elem = rhs[iVar2].m_backend.prec_elem;
      local_1a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
      local_1a8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
      local_1a8.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4)
      ;
      local_1a8.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6)
      ;
      local_1a8.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8)
      ;
      local_1a8.m_backend.exp = (eps->m_backend).exp;
      local_1a8.m_backend.neg = (eps->m_backend).neg;
      local_1a8.m_backend.fpclass = (eps->m_backend).fpclass;
      local_1a8.m_backend.prec_elem = (eps->m_backend).prec_elem;
      bVar4 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_168,&local_1a8);
      if (bVar4) {
        enQueueMax(ridx,(int *)&local_218,local_258[iVar2]);
      }
      else {
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  (&rhs[iVar2].m_backend,0);
      }
    }
    rn = (int)local_218;
  }
  else {
    local_240 = forestIdx;
    local_220 = (this->row).perm;
    local_25c = 0;
    local_248 = ridx;
    for (lVar5 = 0; lVar5 < rn; lVar5 = lVar5 + 1) {
      iVar2 = ridx[lVar5];
      local_1f8 = *(undefined8 *)(rhs[iVar2].m_backend.data._M_elems + 8);
      local_218 = *(ulong *)rhs[iVar2].m_backend.data._M_elems;
      uStack_210 = *(undefined8 *)(rhs[iVar2].m_backend.data._M_elems + 2);
      puVar1 = rhs[iVar2].m_backend.data._M_elems + 4;
      local_208 = *(undefined8 *)puVar1;
      uStack_200 = *(undefined8 *)(puVar1 + 2);
      local_1e8.m_backend.exp = rhs[iVar2].m_backend.exp;
      bVar4 = rhs[iVar2].m_backend.neg;
      local_24c = rhs[iVar2].m_backend.fpclass;
      local_250 = rhs[iVar2].m_backend.prec_elem;
      local_1e8.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)(rhs[iVar2].m_backend.data._M_elems + 8);
      local_1e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)rhs[iVar2].m_backend.data._M_elems;
      local_1e8.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)(rhs[iVar2].m_backend.data._M_elems + 2);
      puVar1 = rhs[iVar2].m_backend.data._M_elems + 4;
      local_1e8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_1e8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      local_258 = (int *)CONCAT44(local_258._4_4_,local_1e8.m_backend.exp);
      local_128.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
      local_128.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
      local_128.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4)
      ;
      local_128.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6)
      ;
      local_128.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8)
      ;
      local_128.m_backend.exp = (eps->m_backend).exp;
      local_128.m_backend.neg = (eps->m_backend).neg;
      local_128.m_backend.fpclass = (eps->m_backend).fpclass;
      local_128.m_backend.prec_elem = (eps->m_backend).prec_elem;
      local_1e8.m_backend.neg = bVar4;
      local_1e8.m_backend.fpclass = local_24c;
      local_1e8.m_backend.prec_elem = local_250;
      bVar3 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_1e8,&local_128);
      ridx = local_248;
      if (bVar3) {
        *local_240 = iVar2;
        local_240 = local_240 + 1;
        enQueueMax(local_248,&local_25c,local_220[iVar2]);
        *(undefined8 *)(forest[iVar2].m_backend.data._M_elems + 8) = local_1f8;
        puVar1 = forest[iVar2].m_backend.data._M_elems + 4;
        *(undefined8 *)puVar1 = local_208;
        *(undefined8 *)(puVar1 + 2) = uStack_200;
        *(ulong *)forest[iVar2].m_backend.data._M_elems = local_218;
        *(undefined8 *)(forest[iVar2].m_backend.data._M_elems + 2) = uStack_210;
        forest[iVar2].m_backend.exp = (int)local_258;
        forest[iVar2].m_backend.neg = bVar4;
        forest[iVar2].m_backend.fpclass = local_24c;
        forest[iVar2].m_backend.prec_elem = local_250;
      }
      else {
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  (&rhs[iVar2].m_backend,0);
        ridx = local_248;
      }
    }
    *forestNum = local_25c;
    rn = local_25c;
  }
  ridx_00 = local_228;
  vec_00 = local_230;
  this_00 = local_238;
  local_a8.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
  local_a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
  local_a8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
  local_a8.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
  local_a8.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
  local_a8.m_backend.exp = (eps->m_backend).exp;
  local_a8.m_backend.neg = (eps->m_backend).neg;
  local_a8.m_backend.fpclass = (eps->m_backend).fpclass;
  local_a8.m_backend.prec_elem = (eps->m_backend).prec_elem;
  rn = vSolveUright(local_238,local_230,local_228,rhs,ridx,rn,&local_a8);
  if ((this_00->l).updateType == 0) {
    local_e8.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
    local_e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
    local_e8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
    local_e8.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
    local_e8.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
    local_e8.m_backend.exp = (eps->m_backend).exp;
    local_e8.m_backend.neg = (eps->m_backend).neg;
    local_e8.m_backend.fpclass = (eps->m_backend).fpclass;
    local_e8.m_backend.prec_elem = (eps->m_backend).prec_elem;
    rn = vSolveUpdateRight(this_00,vec_00,ridx_00,rn,&local_e8);
  }
  return rn;
}

Assistant:

int CLUFactor<R>::vSolveRight4update(R eps,
                                     R* vec, int* idx,                       /* result */
                                     R* rhs, int* ridx, int rn,              /* rhs    */
                                     R* forest, int* forestNum, int* forestIdx)
{
   vSolveLright(rhs, ridx, rn, eps);
   assert(rn >= 0 && rn <= thedim);

   /*  turn index list into a heap
    */

   if(forest)
   {
      R x;
      int i, j, k;
      int* rperm;
      int* it = forestIdx;

      rperm = row.perm;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
         {
            enQueueMax(ridx, &j, rperm[*it++ = k]);
            forest[k] = x;
         }
         else
            rhs[k] = 0;
      }

      *forestNum = rn = j;
   }
   else
   {
      R x;
      int i, j, k;
      int* rperm;

      rperm = row.perm;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
            enQueueMax(ridx, &j, rperm[k]);
         else
            rhs[k] = 0;
      }

      rn = j;
   }

   rn = vSolveUright(vec, idx, rhs, ridx, rn, eps);

   if(!l.updateType)             /* no Forest-Tomlin Updates */
      rn = vSolveUpdateRight(vec, idx, rn, eps);

   return rn;
}